

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall t_swift_generator::init_generator(t_swift_generator *this)

{
  ulong uVar1;
  char *pcVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  ostream *poVar4;
  int __oflag;
  int __oflag_00;
  t_program *in_RDX;
  string local_300;
  string local_2e0;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  string f_impl_fullname;
  string f_impl_name;
  string local_1f8;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  string f_decl_fullname;
  string f_decl_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  int local_e4;
  undefined1 local_e0 [4];
  int r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string name;
  string module_path;
  string local_50 [8];
  string out_dir;
  string module;
  t_swift_generator *this_local;
  
  get_real_swift_module_abi_cxx11_
            ((string *)((long)&out_dir.field_2 + 8),
             (t_swift_generator *)(this->super_t_oop_generator).super_t_generator.program_,in_RDX);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_50);
  std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),local_50);
  std::__cxx11::string::string
            ((string *)local_a0,
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  if ((this->namespaced_ & 1U) != 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name.field_2 + 8),"/");
      std::operator+(&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&out_dir.field_2 + 8));
      std::__cxx11::string::operator=((string *)(name.field_2._M_local_buf + 8),(string *)&local_c0)
      ;
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::operator=
                ((string *)local_a0,(string *)(out_dir.field_2._M_local_buf + 8));
    }
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_e4 = mkdir(pcVar2,0x1ff);
  if (local_e4 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      f_decl_name.field_2._M_local_buf[0xe] = '\x01';
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_128,pcVar2,(allocator *)(f_decl_name.field_2._M_local_buf + 0xf));
      std::operator+(&local_108,&local_128,": ");
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      std::operator+(__return_storage_ptr__,&local_108,pcVar2);
      f_decl_name.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  populate_reserved_words(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_decl_fullname.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 ".swift");
  std::operator+(&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&name.field_2 + 8),"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                 &local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_decl_fullname.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_190);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,pcVar2,&local_1b1);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_decl_,(char *)local_1b0,__oflag);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_1d8);
  poVar4 = std::operator<<((ostream *)&this->f_decl_,local_1d8);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_1d8);
  swift_imports_abi_cxx11_(&local_1f8,this);
  poVar4 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_1f8);
  swift_thrift_imports_abi_cxx11_((string *)((long)&f_impl_name.field_2 + 8),this);
  poVar4 = std::operator<<(poVar4,(string *)(f_impl_name.field_2._M_local_buf + 8));
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(f_impl_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_impl_fullname.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 "+Exts.swift");
  std::operator+(&local_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&name.field_2 + 8),"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 &local_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_impl_fullname.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_278);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,pcVar2,&local_299);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_impl_,(char *)local_298,__oflag_00);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_2c0);
  poVar4 = std::operator<<((ostream *)&this->f_impl_,local_2c0);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_2c0);
  swift_imports_abi_cxx11_(&local_2e0,this);
  poVar4 = std::operator<<((ostream *)&this->f_impl_,(string *)&local_2e0);
  swift_thrift_imports_abi_cxx11_(&local_300,this);
  poVar4 = std::operator<<(poVar4,(string *)&local_300);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)(f_impl_fullname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)(f_decl_fullname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(out_dir.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_swift_generator::init_generator() {
  // Make output directory
  string module = get_real_swift_module(program_);
  string out_dir = get_out_dir();
  string module_path = out_dir;
  string name = program_name_;
  if (namespaced_ && !module.empty()) {
    module_path = module_path + "/" + module;
    name = module;
  }
  MKDIR(module_path.c_str());

  populate_reserved_words();

  // we have a .swift declarations file...
  string f_decl_name = name + ".swift";
  string f_decl_fullname = module_path + "/" + f_decl_name;
  f_decl_.open(f_decl_fullname.c_str());

  f_decl_ << autogen_comment() << endl;

  f_decl_ << swift_imports() << swift_thrift_imports() << endl;

  // ...and a .swift implementation extensions file
  string f_impl_name = name + "+Exts.swift";
  string f_impl_fullname = module_path + "/" + f_impl_name;
  f_impl_.open(f_impl_fullname.c_str());

  f_impl_ << autogen_comment() << endl;

  f_impl_ << swift_imports() << swift_thrift_imports() << endl;

}